

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

function<void_(Pipeline_*)> *
QUtil::file_provider(function<void_(Pipeline_*)> *__return_storage_ptr__,string *filename)

{
  string *this;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)filename);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this,asStack_38);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = this;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(Pipeline_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QUtil.cc:665:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(Pipeline_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QUtil.cc:665:12)>
       ::_M_manager;
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(Pipeline*)>
QUtil::file_provider(std::string const& filename)
{
    return [filename](Pipeline* p) { pipe_file(filename.c_str(), p); };
}